

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void pstack::print_container<pstack::ReaderArray<Elf64_Sym,42ul>,pstack::Elf::Section_const&>
               (ostream *os,ReaderArray<Elf64_Sym,_42UL> *container,Section *ctx)

{
  value_type *pvVar1;
  ostream *os_00;
  char *pcVar2;
  JSON<Elf64_Sym,_pstack::Elf::Section> local_50;
  iterator local_40;
  
  std::operator<<(os,"[ ");
  pcVar2 = "";
  local_40.arrayp = container;
  for (local_40.idx = 0; local_40.idx != (local_40.arrayp)->eof; local_40.idx = local_40.idx + 1) {
    pvVar1 = ReaderArray<Elf64_Sym,_42UL>::iterator::operator*(&local_40);
    os_00 = std::operator<<(os,pcVar2);
    local_50.object = pvVar1;
    local_50.context = ctx;
    operator<<(os_00,&local_50);
    pcVar2 = ",\n";
  }
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}